

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

char * __thiscall
glcts::TextureBufferActiveUniformValidation::getUniformTypeName
          (TextureBufferActiveUniformValidation *this,GLenum uniformType)

{
  char *pcVar1;
  
  if ((this->super_TestCaseBase).m_glExtTokens.SAMPLER_BUFFER == uniformType) {
    return "GL_SAMPLER_BUFFER_EXT";
  }
  if ((this->super_TestCaseBase).m_glExtTokens.INT_SAMPLER_BUFFER == uniformType) {
    return "GL_INT_SAMPLER_BUFFER_EXT";
  }
  if ((this->super_TestCaseBase).m_glExtTokens.UNSIGNED_INT_SAMPLER_BUFFER == uniformType) {
    return "GL_UNSIGNED_INT_SAMPLER_BUFFER_EXT";
  }
  if ((this->super_TestCaseBase).m_glExtTokens.IMAGE_BUFFER == uniformType) {
    return "GL_IMAGE_BUFFER_EXT";
  }
  if ((this->super_TestCaseBase).m_glExtTokens.INT_IMAGE_BUFFER == uniformType) {
    return "GL_INT_IMAGE_BUFFER_EXT";
  }
  pcVar1 = "UNKNOWN";
  if ((this->super_TestCaseBase).m_glExtTokens.UNSIGNED_INT_IMAGE_BUFFER == uniformType) {
    pcVar1 = "GL_UNSIGNED_INT_IMAGE_BUFFER_EXT";
  }
  return pcVar1;
}

Assistant:

const char* TextureBufferActiveUniformValidation::getUniformTypeName(glw::GLenum uniformType)
{
	static const char* str_GL_SAMPLER_BUFFER_EXT			  = "GL_SAMPLER_BUFFER_EXT";
	static const char* str_GL_INT_SAMPLER_BUFFER_EXT		  = "GL_INT_SAMPLER_BUFFER_EXT";
	static const char* str_GL_UNSIGNED_INT_SAMPLER_BUFFER_EXT = "GL_UNSIGNED_INT_SAMPLER_BUFFER_EXT";
	static const char* str_GL_IMAGE_BUFFER_EXT				  = "GL_IMAGE_BUFFER_EXT";
	static const char* str_GL_INT_IMAGE_BUFFER_EXT			  = "GL_INT_IMAGE_BUFFER_EXT";
	static const char* str_GL_UNSIGNED_INT_IMAGE_BUFFER_EXT   = "GL_UNSIGNED_INT_IMAGE_BUFFER_EXT";
	static const char* str_UNKNOWN							  = "UNKNOWN";

	if (uniformType == m_glExtTokens.SAMPLER_BUFFER)
	{
		return str_GL_SAMPLER_BUFFER_EXT;
	}
	else if (uniformType == m_glExtTokens.INT_SAMPLER_BUFFER)
	{
		return str_GL_INT_SAMPLER_BUFFER_EXT;
	}
	else if (uniformType == m_glExtTokens.UNSIGNED_INT_SAMPLER_BUFFER)
	{
		return str_GL_UNSIGNED_INT_SAMPLER_BUFFER_EXT;
	}
	else if (uniformType == m_glExtTokens.IMAGE_BUFFER)
	{
		return str_GL_IMAGE_BUFFER_EXT;
	}
	else if (uniformType == m_glExtTokens.INT_IMAGE_BUFFER)
	{
		return str_GL_INT_IMAGE_BUFFER_EXT;
	}
	else if (uniformType == m_glExtTokens.UNSIGNED_INT_IMAGE_BUFFER)
	{
		return str_GL_UNSIGNED_INT_IMAGE_BUFFER_EXT;
	}
	else
	{
		return str_UNKNOWN;
	}
}